

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O1

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  long *plVar5;
  ulong uVar6;
  size_type *psVar7;
  char cVar8;
  ulong in_stack_0000000c;
  string __str;
  string ckID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  long *local_68;
  uint local_60;
  long local_58 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  sVar4 = strlen(&stack0x00000008);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,&stack0x00000008,&stack0x00000008 + sVar4);
  std::__cxx11::string::resize((ulong)&local_48,'\x04');
  std::operator+(&local_88,"ChunkID: ",&local_48);
  PrintLog(&local_88,(ostream *)&std::cout);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  cVar8 = '\x01';
  if (9 < in_stack_0000000c) {
    uVar6 = in_stack_0000000c;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar6 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00107536;
      }
      if (uVar6 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00107536;
      }
      if (uVar6 < 10000) goto LAB_00107536;
      bVar2 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_00107536:
  local_68 = local_58;
  std::__cxx11::string::_M_construct((ulong)&local_68,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_68,local_60,in_stack_0000000c);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x10b101);
  psVar7 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_88.field_2._M_allocated_capacity = *psVar7;
    local_88.field_2._8_8_ = plVar5[3];
    local_88._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.field_2._M_allocated_capacity = *psVar7;
    local_88._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_88._M_string_length = plVar5[1];
  *plVar5 = (long)psVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  PrintLog(&local_88,(ostream *)&std::cout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WavParserHelper::PrintJunkChunk(JunkChunk rhs)
{
	std::string ckID(rhs.ckID);
	ckID.resize(4);

	PrintLog("ChunkID: " + ckID);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	std::cout << std::endl;
}